

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::ComputeBuildFileGenerators(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  uint uVar2;
  ulong uVar3;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> gens;
  _Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> local_38
  ;
  
  for (uVar2 = 0; uVar3 = (ulong)uVar2,
      uVar3 < (ulong)((long)(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->LocalGenerators).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    cmMakefile::GetExportBuildFileGenerators
              ((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                *)&local_38,
               (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3]);
    for (ppcVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
        ppcVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
      cmExportBuildFileGenerator::Compute
                (*ppcVar1,(this->LocalGenerators).
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3]);
    }
    std::_Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
    ~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeBuildFileGenerators()
{
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmExportBuildFileGenerator*> gens =
      this->Makefiles[i]->GetExportBuildFileGenerators();
    for (std::vector<cmExportBuildFileGenerator*>::const_iterator it =
           gens.begin();
         it != gens.end(); ++it) {
      (*it)->Compute(this->LocalGenerators[i]);
    }
  }
}